

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_dec.c
# Opt level: O0

VP8StatusCode
WebPAllocateDecBuffer(int width,int height,WebPDecoderOptions *options,WebPDecBuffer *buffer)

{
  int iVar1;
  int iVar2;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  int in_EDI;
  int scaled_height;
  int scaled_width;
  int y;
  int x;
  int ch;
  int cw;
  VP8StatusCode status;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  VP8StatusCode local_24;
  int local_c;
  int local_8;
  VP8StatusCode local_4;
  
  if (((in_RCX == 0) || (in_EDI < 1)) || (in_ESI < 1)) {
    local_4 = VP8_STATUS_INVALID_PARAM;
  }
  else {
    local_c = in_ESI;
    local_8 = in_EDI;
    if (in_RDX != 0) {
      local_c = in_ESI;
      if (*(int *)(in_RDX + 8) != 0) {
        local_8 = *(int *)(in_RDX + 0x14);
        local_c = *(int *)(in_RDX + 0x18);
        in_stack_ffffffffffffffcc = *(uint *)(in_RDX + 0x10) & 0xfffffffe;
        iVar1 = WebPCheckCropDimensions
                          (local_c,*(uint *)(in_RDX + 0xc) & 0xfffffffe,in_stack_ffffffffffffffcc,
                           in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                           in_stack_ffffffffffffffc0);
        if (iVar1 == 0) {
          return VP8_STATUS_INVALID_PARAM;
        }
      }
      if (*(int *)(in_RDX + 0x1c) != 0) {
        in_stack_ffffffffffffffc8 = *(int *)(in_RDX + 0x20);
        iVar1 = *(int *)(in_RDX + 0x24);
        iVar2 = WebPRescalerGetScaledDimensions
                          (local_8,local_c,(int *)&stack0xffffffffffffffc8,
                           (int *)&stack0xffffffffffffffc4);
        local_c = iVar1;
        local_8 = in_stack_ffffffffffffffc8;
        if (iVar2 == 0) {
          return VP8_STATUS_INVALID_PARAM;
        }
      }
    }
    *(int *)(in_RCX + 4) = local_8;
    *(int *)(in_RCX + 8) = local_c;
    local_24 = AllocateBuffer(_x);
    local_4 = local_24;
    if (local_24 == VP8_STATUS_OK) {
      if ((in_RDX != 0) && (*(int *)(in_RDX + 0x30) != 0)) {
        local_24 = WebPFlipBuffer((WebPDecBuffer *)
                                  CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      local_4 = local_24;
    }
  }
  return local_4;
}

Assistant:

VP8StatusCode WebPAllocateDecBuffer(int width, int height,
                                    const WebPDecoderOptions* const options,
                                    WebPDecBuffer* const buffer) {
  VP8StatusCode status;
  if (buffer == NULL || width <= 0 || height <= 0) {
    return VP8_STATUS_INVALID_PARAM;
  }
  if (options != NULL) {    // First, apply options if there is any.
    if (options->use_cropping) {
      const int cw = options->crop_width;
      const int ch = options->crop_height;
      const int x = options->crop_left & ~1;
      const int y = options->crop_top & ~1;
      if (!WebPCheckCropDimensions(width, height, x, y, cw, ch)) {
        return VP8_STATUS_INVALID_PARAM;   // out of frame boundary.
      }
      width = cw;
      height = ch;
    }

    if (options->use_scaling) {
#if !defined(WEBP_REDUCE_SIZE)
      int scaled_width = options->scaled_width;
      int scaled_height = options->scaled_height;
      if (!WebPRescalerGetScaledDimensions(
              width, height, &scaled_width, &scaled_height)) {
        return VP8_STATUS_INVALID_PARAM;
      }
      width = scaled_width;
      height = scaled_height;
#else
      return VP8_STATUS_INVALID_PARAM;   // rescaling not supported
#endif
    }
  }
  buffer->width = width;
  buffer->height = height;

  // Then, allocate buffer for real.
  status = AllocateBuffer(buffer);
  if (status != VP8_STATUS_OK) return status;

  // Use the stride trick if vertical flip is needed.
  if (options != NULL && options->flip) {
    status = WebPFlipBuffer(buffer);
  }
  return status;
}